

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_enc.c
# Opt level: O2

void VP8InitFilter(VP8EncIterator *it)

{
  int iVar1;
  double (*padVar2) [64];
  long lVar3;
  long lVar4;
  
  padVar2 = *it->lf_stats_;
  if ((LFStats *)padVar2 == (LFStats *)0x0) {
    return;
  }
  for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
    for (lVar4 = 0; lVar4 != 0x40; lVar4 = lVar4 + 1) {
      (*(double (*) [64])*padVar2)[lVar4] = 0.0;
    }
    padVar2 = padVar2 + 1;
  }
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&VP8SSIMDspInit::VP8SSIMDspInit_body_lock);
  if (iVar1 != 0) {
    return;
  }
  if (VP8SSIMDspInit::VP8SSIMDspInit_body_last_cpuinfo_used != VP8GetCPUInfo) {
    VP8SSIMGetClipped = SSIMGetClipped_C;
    VP8SSIMGet = SSIMGet_C;
    VP8AccumulateSSE = AccumulateSSE_C;
    if (VP8GetCPUInfo != (VP8CPUInfo)0x0) {
      iVar1 = (*VP8GetCPUInfo)(kSSE2);
      if (iVar1 != 0) {
        VP8SSIMDspInitSSE2();
      }
    }
  }
  VP8SSIMDspInit::VP8SSIMDspInit_body_last_cpuinfo_used = VP8GetCPUInfo;
  pthread_mutex_unlock((pthread_mutex_t *)&VP8SSIMDspInit::VP8SSIMDspInit_body_lock);
  return;
}

Assistant:

void VP8InitFilter(VP8EncIterator* const it) {
#if !defined(WEBP_REDUCE_SIZE)
  if (it->lf_stats_ != NULL) {
    int s, i;
    for (s = 0; s < NUM_MB_SEGMENTS; s++) {
      for (i = 0; i < MAX_LF_LEVELS; i++) {
        (*it->lf_stats_)[s][i] = 0;
      }
    }
    VP8SSIMDspInit();
  }
#else
  (void)it;
#endif
}